

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O2

int mfndpos(monst *mon,coord *poss,long *info,long flag)

{
  byte *pbVar1;
  char x;
  char y;
  char cVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  permonst *mdat;
  monst *pmVar6;
  permonst *ppVar7;
  permonst *ppVar8;
  byte bVar9;
  char cVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  level *lev;
  boolean bVar14;
  int iVar15;
  obj *poVar16;
  ulong uVar17;
  char *pcVar18;
  trap *ptVar19;
  uint uVar20;
  byte bVar21;
  char y_00;
  long lVar22;
  int y_01;
  int iVar23;
  int iVar24;
  char x_00;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  byte local_e1;
  ulong local_e0;
  int local_bc;
  uint local_b0;
  
  mdat = mon->data;
  x = mon->mx;
  y = mon->my;
  cVar2 = mdat->mlet;
  uVar20 = mdat->mflags1;
  bVar25 = (uVar20 & 0x11) == 0;
  if (bVar25) {
    local_e1 = (byte)uVar20 >> 1 & cVar2 != '9';
  }
  else {
    local_e1 = 1;
  }
  bVar28 = true;
  cVar3 = level->locations[x][y].typ;
  bVar26 = (flag & 0x5000000U) != 0;
  bVar27 = true;
  if (((uint)flag >> 0x1b & 1) != 0) {
    bVar28 = true;
    bVar27 = true;
    if ((uVar20 & 0x40) != 0) {
      poVar16 = mon->mw;
      if (((poVar16 == (obj *)0x0) || ((poVar16->field_0x4a & 1) == 0)) ||
         (mon->weapon_check != '\0')) {
        poVar16 = m_carrying(mon,0x108);
        bVar27 = true;
        if (poVar16 == (obj *)0x0) {
          poVar16 = m_carrying(mon,0x33);
          if (poVar16 == (obj *)0x0) {
            bVar27 = false;
          }
          else {
            poVar16 = which_armor(mon,8);
            bVar27 = poVar16 == (obj *)0x0;
          }
        }
        poVar16 = m_carrying(mon,0x1b);
        if (poVar16 == (obj *)0x0) {
          poVar16 = m_carrying(mon,0x1c);
          if (poVar16 == (obj *)0x0) {
            bVar28 = false;
          }
          else {
            poVar16 = which_armor(mon,8);
            bVar28 = poVar16 == (obj *)0x0;
          }
        }
        else {
          bVar28 = true;
        }
      }
      else if ((byte)(poVar16->oclass | 4U) == 6) {
        bVar27 = objects[poVar16->otyp].oc_subtyp == '\x04';
        bVar28 = objects[poVar16->otyp].oc_subtyp == '\x03';
      }
      else {
        bVar27 = false;
        bVar28 = false;
      }
    }
    bVar26 = (bool)(bVar27 | bVar28 | (flag & 0x5000000U) != 0);
    bVar27 = !bVar27;
    bVar28 = (bool)(bVar28 ^ 1);
  }
  local_b0 = (uint)(cVar2 == '9');
  iVar15 = (int)x;
  iVar11 = 0x4e;
  if (iVar15 < 0x4e) {
    iVar11 = iVar15;
  }
  iVar24 = (int)y;
  iVar12 = 0x13;
  if (iVar24 < 0x13) {
    iVar12 = iVar24;
  }
  cVar2 = '\x02';
  if (2 < iVar15) {
    cVar2 = x;
  }
  cVar10 = '\x01';
  if (1 < iVar24) {
    cVar10 = y;
  }
  local_e0 = flag;
  do {
    uVar17 = local_e0 & 0xffffffffffc1ffff | 0x1e0000;
    if ((*(uint *)&mon->field_0x60 >> 0x15 & 1) == 0) {
      uVar17 = local_e0;
    }
    local_e0 = uVar17 | 0x40000000;
    if ((*(uint *)&mon->field_0x60 >> 0x11 & 1) != 0) {
      local_e0 = uVar17;
    }
    local_bc = 0;
    for (x_00 = cVar2 + -1; iVar15 = (int)x_00, iVar15 <= iVar11 + 1; x_00 = x_00 + '\x01') {
      for (y_00 = cVar10 + -1; iVar24 = (int)y_00, iVar24 <= iVar12 + 1; y_00 = y_00 + '\x01') {
        if ((x_00 == x) && (y == y_00)) goto LAB_001dd63f;
        bVar21 = level->locations[x_00][y_00].typ;
        if (bVar21 < 0x11) {
          if ((((uint)local_e0 >> 0x1a & 1) != 0) &&
             (bVar14 = may_passwall(level,x_00,y_00), bVar14 != '\0')) {
LAB_001dce64:
            bVar13 = false;
            goto LAB_001dce9d;
          }
          bVar13 = bVar28;
          if ((bVar21 != 0xd) &&
             ((bVar21 != 0 || ((*(uint *)&(level->flags).field_0x8 & 0x100000) == 0)))) {
            bVar13 = bVar27;
          }
          if ((!bVar13) && (bVar14 = may_dig(level,x_00,y_00), bVar14 != '\0')) {
            bVar13 = false;
            goto LAB_001dce9d;
          }
          goto LAB_001dd63f;
        }
        if ((bVar21 == 0x16) && ((local_e0 & 0x10000000) == 0)) goto LAB_001dd63f;
        if (bVar21 != 0x17) goto LAB_001dce64;
        bVar13 = true;
        if ((mdat->mflags1 & 4) == 0) {
          uVar20 = *(uint *)&level->locations[x_00][y_00].field_0x6;
          if (((uVar20 & 0x40) == 0) || ((local_e0 & 0x400000) != 0)) {
            if (((local_e0 >> 0x17 & 1) != 0 || bVar26) || -1 < (char)uVar20) goto LAB_001dce9d;
          }
          else if (bVar26) goto LAB_001dce9d;
          goto LAB_001dd63f;
        }
LAB_001dce9d:
        if (((x_00 != x && y != y_00) &&
            (((mdat == mons + 0x78 ||
              ((cVar3 == '\x17' &&
               (((*(ushort *)&level->locations[x][y].field_0x6 & 0x1e0) != 0 ||
                (bVar14 = on_level(&u.uz,&dungeon_topology.d_rogue_level), bVar14 != '\0')))))) ||
             ((bVar13 &&
              (((*(ushort *)&level->locations[x_00][y_00].field_0x6 & 0x1e0) != 0 ||
               (bVar14 = on_level(&u.uz,&dungeon_topology.d_rogue_level), bVar14 != '\0')))))))) ||
           ((bVar14 = is_pool(level,iVar15,iVar24), local_b0 != (int)bVar14 && local_e1 == 0 ||
            ((bVar25 && (mdat != mons + 0x157 && mdat != mons + 0xa0) &&
             (bVar14 = is_lava(level,iVar15,iVar24), bVar14 != '\0')))))) goto LAB_001dd63f;
        if ((mon->field_0x62 & 2) == 0) {
          bVar21 = 0;
        }
        else {
          bVar21 = 1;
          if (((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
               (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
             (u.uprops[0xd].blocked == 0)) {
            bVar21 = *(byte *)((long)&mdat->mflags1 + 3) & 1;
          }
        }
        iVar23 = iVar15;
        y_01 = iVar24;
        if ((((u.uprops[0x2d].extrinsic != 0) && (bVar21 != 0)) && (mon->mux == x_00)) &&
           (y_00 == mon->muy)) {
          iVar23 = (int)u.ux;
          y_01 = (int)u.uy;
        }
        poVar16 = level->objects[x_00][y_00];
        lVar22 = (long)local_bc;
        info[lVar22] = 0;
        if (((poVar16 != (obj *)0x0) || (u.uprops[0x2d].extrinsic != 0)) &&
           (bVar14 = onscary(iVar23,y_01,mon), bVar14 != '\0')) {
          if (((uint)local_e0 >> 0x1e & 1) == 0) goto LAB_001dd63f;
          pbVar1 = (byte *)((long)info + lVar22 * 8 + 3);
          *pbVar1 = *pbVar1 | 0x40;
        }
        lev = level;
        if ((x_00 == u.ux) && (y_00 == u.uy)) {
          mon->mux = x_00;
          mon->muy = y_00;
LAB_001dd16b:
          uVar17 = 0x40000;
          uVar20 = (uint)local_e0 >> 0x12;
joined_r0x001dd54a:
          if ((uVar20 & 1) == 0) goto LAB_001dd63f;
          info[lVar22] = info[lVar22] | uVar17;
        }
        else {
          if ((x_00 == mon->mux) && (y_00 == mon->muy)) goto LAB_001dd16b;
          pmVar6 = level->monsters[x_00][y_00];
          if ((pmVar6 != (monst *)0x0) && ((*(uint *)&pmVar6->field_0x60 >> 9 & 1) == 0)) {
            ppVar7 = mon->data;
            ppVar8 = pmVar6->data;
            uVar20 = 0x180000;
            if (((ppVar7 != mons + 0x77) || (ppVar8 != (permonst *)0x302330)) &&
               ((((*(uint *)&pmVar6->field_0x60 >> 0x16 & 1) != 0 || (ppVar7->msound != '!')) &&
                ((ppVar8->msound != '!' || ((mon->field_0x62 & 0x40) != 0)))))) {
              uVar4 = ppVar7->mflags2;
              uVar5 = ppVar8->mflags2;
              if (((((uVar4 & 0x10) == 0) || ((uVar5 & 0x80) == 0)) &&
                  ((-1 < (char)uVar4 || ((uVar5 & 0x10) == 0)))) &&
                 (((((uVar5 >> 9 & 1) == 0 || (ppVar7->mlet != '\x1b')) &&
                   (((uVar4 >> 9 & 1) == 0 || (ppVar8->mlet != '\x1b')))) &&
                  (((ppVar7 != mons + 0x61 || (ppVar8 != (permonst *)0x3040b0)) &&
                   (uVar20 = 0, ppVar8 == (permonst *)0x3000b0 && ppVar7 == mons + 0x84)))))) {
                uVar20 = 0x180000;
              }
            }
            if (((uVar20 | (uint)local_e0) >> 0x13 & 1) == 0) goto LAB_001dd63f;
            uVar17 = info[lVar22];
            info[lVar22] = uVar17 | 0x80000;
            if (pmVar6->mtame != '\0') {
              if (((uVar20 | (uint)local_e0) >> 0x14 & 1) == 0) goto LAB_001dd63f;
              info[lVar22] = uVar17 | 0x180000;
            }
          }
          if (((((lev->flags).field_0x9 & 1) != 0) &&
              (pcVar18 = in_rooms(lev,x_00,y_00,10), *pcVar18 != '\0')) &&
             ((pcVar18 = in_rooms(level,x,y,10), *pcVar18 == '\0' &&
              (bVar14 = in_your_sanctuary((monst *)0x0,x_00,y_00), bVar14 != '\0')))) {
            uVar17 = 0x20000000;
            uVar20 = (uint)local_e0 >> 0x1d;
            goto joined_r0x001dd54a;
          }
        }
        if (poVar16 != (obj *)0x0) {
          poVar16 = sobj_at(0x11d,level,iVar15,iVar24);
          if (poVar16 != (obj *)0x0) {
            if ((int)(uint)local_e0 < 0) goto LAB_001dd63f;
            info[lVar22] = info[lVar22] | 0x80000000;
          }
          poVar16 = sobj_at(0x214,level,iVar15,iVar24);
          if (poVar16 != (obj *)0x0) {
            if (((uint)local_e0 >> 0x19 & 1) == 0) goto LAB_001dd63f;
            pbVar1 = (byte *)((long)info + lVar22 * 8 + 3);
            *pbVar1 = *pbVar1 | 2;
          }
        }
        if ((bVar21 != 0) && (bVar14 = online2(iVar15,iVar24,(int)u.ux,(int)u.uy), bVar14 != '\0'))
        {
          if (((uint)local_e0 >> 0x15 & 1) != 0) goto LAB_001dd63f;
          pbVar1 = (byte *)((long)info + lVar22 * 8 + 2);
          *pbVar1 = *pbVar1 | 0x20;
        }
        if ((((x_00 != x && y != y_00) && (bVar14 = bad_rock(mdat,'\0',x,y_00), bVar14 != '\0')) &&
            (bVar14 = bad_rock(mdat,'\0',x_00,y), bVar14 != '\0')) &&
           ((2 < mdat->msize || (iVar23 = curr_mon_load(mon), 600 < iVar23)))) goto LAB_001dd63f;
        ptVar19 = t_at(level,iVar15,iVar24);
        if (ptVar19 == (trap *)0x0) goto LAB_001dd622;
        bVar21 = ptVar19->field_0x8 & 0x1f;
        if ((byte)(bVar21 - 0x19) < 0xe8) {
          impossible("A monster looked at a very strange trap of type %d.");
          goto LAB_001dd63f;
        }
        if ((bVar21 == 0x14) || (bVar21 == 9 && mdat != mons + 0x10a)) goto LAB_001dd622;
        if ((byte)(bVar21 - 0xb) < 4) {
          if (((((mdat->mflags1 & 1) == 0) && ((mdat->mflags1 & 0x10) == 0)) &&
              (mdat->mlet != '\x05')) || (u.uz.dnum == dungeon_topology.d_sokoban_dnum))
          goto switchD_001dd56f_caseD_6;
          goto LAB_001dd622;
        }
        switch(bVar21) {
        case 4:
          bVar9 = (byte)mdat->mflags1 & 1;
          break;
        case 5:
          if (mdat->msize < 2) goto LAB_001dd622;
          bVar9 = (byte)mdat->mflags1 & 5;
          break;
        case 6:
        case 7:
        case 9:
          goto switchD_001dd56f_caseD_6;
        case 8:
          bVar9 = (byte)mon->mintrinsics & 4;
          break;
        case 10:
          bVar9 = (byte)mon->mintrinsics & 1;
          break;
        default:
          if ((bVar21 == 0x13) &&
             ((mdat == mons + 0x62 || mdat == mons + 100) || (mdat->mflags1 & 4) != 0))
          goto LAB_001dd622;
          goto switchD_001dd56f_caseD_6;
        }
        if (bVar9 == 0) {
switchD_001dd56f_caseD_6:
          if ((((uint)local_e0 >> 0x11 & 1) != 0) ||
             ((mon->mtrapseen & (uint)(1L << (bVar21 - 1 & 0x3f))) == 0)) {
            pbVar1 = (byte *)((long)info + lVar22 * 8 + 2);
            *pbVar1 = *pbVar1 | 2;
            goto LAB_001dd622;
          }
        }
        else {
LAB_001dd622:
          poss[lVar22].x = x_00;
          poss[lVar22].y = y_00;
          local_bc = local_bc + 1;
        }
LAB_001dd63f:
      }
    }
    if (local_bc != 0) {
      return local_bc;
    }
    if (local_b0 == 0) {
      return 0;
    }
    bVar14 = is_pool(level,(int)x,(int)y);
    local_b0 = 0;
    if (bVar14 != '\0') {
      return 0;
    }
  } while( true );
}

Assistant:

int mfndpos(struct monst *mon,
	    coord *poss,	/* coord poss[9] */
	    long *info,		/* long info[9] */
	    long flag)
{
	const struct permonst *mdat = mon->data;
	xchar x,y,nx,ny;
	int cnt = 0;
	uchar ntyp;
	uchar nowtyp;
	boolean wantpool,poolok,lavaok,nodiag;
	boolean rockok = FALSE, treeok = FALSE, thrudoor;
	int maxx, maxy;

	x = mon->mx;
	y = mon->my;
	nowtyp = level->locations[x][y].typ;

	nodiag = (mdat == &mons[PM_GRID_BUG]);
	wantpool = mdat->mlet == S_EEL;
	poolok = is_flyer(mdat) || is_clinger(mdat) ||
		 (is_swimmer(mdat) && !wantpool);
	lavaok = is_flyer(mdat) || is_clinger(mdat) || likes_lava(mdat);
	thrudoor = ((flag & (ALLOW_WALL|BUSTDOOR)) != 0L);
	if (flag & ALLOW_DIG) {
	    struct obj *mw_tmp;

	    /* need to be specific about what can currently be dug */
	    if (!needspick(mdat)) {
		rockok = treeok = TRUE;
	    } else if ((mw_tmp = MON_WEP(mon)) && mw_tmp->cursed &&
		       mon->weapon_check == NO_WEAPON_WANTED) {
		rockok = is_pick(mw_tmp);
		treeok = is_axe(mw_tmp);
	    } else {
		rockok = (m_carrying(mon, PICK_AXE) ||
			  (m_carrying(mon, DWARVISH_MATTOCK) &&
			   !which_armor(mon, W_ARMS)));
		treeok = (m_carrying(mon, AXE) ||
			  (m_carrying(mon, BATTLE_AXE) &&
			   !which_armor(mon, W_ARMS)));
	    }
	    thrudoor |= rockok || treeok;
	}

nexttry:	/* eels prefer the water, but if there is no water nearby,
		   they will crawl over land */
	if (mon->mconf) {
		flag |= ALLOW_ALL;
		flag &= ~NOTONL;
	}
	if (!mon->mcansee)
		flag |= ALLOW_SSM;
	maxx = min(x+1,COLNO-1);
	maxy = min(y+1,ROWNO-1);
	for (nx = max(1,x-1); nx <= maxx; nx++)
	  for (ny = max(0,y-1); ny <= maxy; ny++) {
	    if (nx == x && ny == y) continue;
	    if (IS_ROCK(ntyp = level->locations[nx][ny].typ) &&
	       !((flag & ALLOW_WALL) && may_passwall(level, nx,ny)) &&
	       !((IS_TREE(level, ntyp) ? treeok : rockok) && may_dig(level, nx,ny))) continue;
	    /* KMH -- Added iron bars */
	    if (ntyp == IRONBARS && !(flag & ALLOW_BARS)) continue;
	    if (IS_DOOR(ntyp) && !amorphous(mdat) &&
	       ((level->locations[nx][ny].doormask & D_CLOSED && !(flag & OPENDOOR)) ||
		(level->locations[nx][ny].doormask & D_LOCKED && !(flag & UNLOCKDOOR))) &&
	       !thrudoor) continue;
	    if (nx != x && ny != y && (nodiag ||
	       ((IS_DOOR(nowtyp) &&
		 ((level->locations[x][y].doormask & ~D_BROKEN) || Is_rogue_level(&u.uz))) ||
		(IS_DOOR(ntyp) &&
		 ((level->locations[nx][ny].doormask & ~D_BROKEN) || Is_rogue_level(&u.uz))))
	       ))
		continue;
	    if ((is_pool(level, nx,ny) == wantpool || poolok) &&
	       (lavaok || !is_lava(level, nx,ny))) {
		int dispx, dispy;
		boolean monseeu = (mon->mcansee && (!Invis || perceives(mdat)));
		boolean checkobj = OBJ_AT(nx, ny);

		/* Displacement also displaces the Elbereth/scare monster,
		 * as long as you are visible.
		 */
		if (Displaced && monseeu && (mon->mux==nx) && (mon->muy==ny)) {
		    dispx = u.ux;
		    dispy = u.uy;
		} else {
		    dispx = nx;
		    dispy = ny;
		}

		info[cnt] = 0;
		if ((checkobj || Displaced) && onscary(dispx, dispy, mon)) {
		    if (!(flag & ALLOW_SSM)) continue;
		    info[cnt] |= ALLOW_SSM;
		}
		if ((nx == u.ux && ny == u.uy) ||
		   (nx == mon->mux && ny == mon->muy)) {
			if (nx == u.ux && ny == u.uy) {
				/* If it's right next to you, it found you,
				 * displaced or no.  We must set mux and muy
				 * right now, so when we return we can tell
				 * that the ALLOW_U means to attack _you_ and
				 * not the image.
				 */
				mon->mux = u.ux;
				mon->muy = u.uy;
			}
			if (!(flag & ALLOW_U)) continue;
			info[cnt] |= ALLOW_U;
		} else {
			if (MON_AT(level, nx, ny)) {
				struct monst *mtmp2 = m_at(level, nx, ny);
				long mmflag = flag | mm_aggression(mon, mtmp2);

				if (!(mmflag & ALLOW_M)) continue;
				info[cnt] |= ALLOW_M;
				if (mtmp2->mtame) {
					if (!(mmflag & ALLOW_TM)) continue;
					info[cnt] |= ALLOW_TM;
				}
			}
			/* Note: ALLOW_SANCT only prevents movement, not */
			/* attack, into a temple. */
			if (level->flags.has_temple &&
			   *in_rooms(level, nx, ny, TEMPLE) &&
			   !*in_rooms(level, x, y, TEMPLE) &&
			   in_your_sanctuary(NULL, nx, ny)) {
				if (!(flag & ALLOW_SANCT)) continue;
				info[cnt] |= ALLOW_SANCT;
			}
		}
		if (checkobj && sobj_at(CLOVE_OF_GARLIC, level, nx, ny)) {
			if (flag & NOGARLIC) continue;
			info[cnt] |= NOGARLIC;
		}
		if (checkobj && sobj_at(BOULDER, level, nx, ny)) {
			if (!(flag & ALLOW_ROCK)) continue;
			info[cnt] |= ALLOW_ROCK;
		}
		if (monseeu && onlineu(nx,ny)) {
			if (flag & NOTONL) continue;
			info[cnt] |= NOTONL;
		}
		if (nx != x && ny != y && bad_rock(mdat, FALSE, x, ny)
			    && bad_rock(mdat, FALSE, nx, y)
			    && (bigmonst(mdat) || (curr_mon_load(mon) > 600)))
			continue;
		/* The monster avoids a particular type of trap if it's familiar
		 * with the trap type.  Pets get ALLOW_TRAPS and checking is
		 * done in dogmove.c.  In either case, "harmless" traps are
		 * neither avoided nor marked in info[].
		 */
		{ struct trap *ttmp = t_at(level, nx, ny);
		    if (ttmp) {
			if (ttmp->ttyp >= TRAPNUM || ttmp->ttyp == 0)  {
impossible("A monster looked at a very strange trap of type %d.", ttmp->ttyp);
			    continue;
			}
			if ((ttmp->ttyp != RUST_TRAP
					|| mdat == &mons[PM_IRON_GOLEM])
				&& ttmp->ttyp != STATUE_TRAP
				&& ((ttmp->ttyp != PIT
				    && ttmp->ttyp != SPIKED_PIT
				    && ttmp->ttyp != TRAPDOOR
				    && ttmp->ttyp != HOLE)
				      || (!is_flyer(mdat)
				    && !is_floater(mdat)
				    && !is_clinger(mdat))
				      || In_sokoban(&u.uz))
				&& (ttmp->ttyp != SLP_GAS_TRAP ||
				    !resists_sleep(mon))
				&& (ttmp->ttyp != BEAR_TRAP ||
				    (mdat->msize > MZ_SMALL &&
				     !amorphous(mdat) && !is_flyer(mdat)))
				&& (ttmp->ttyp != FIRE_TRAP ||
				    !resists_fire(mon))
				&& (ttmp->ttyp != SQKY_BOARD || !is_flyer(mdat))
				&& (ttmp->ttyp != WEB || (!amorphous(mdat) &&
				    !webmaker(mdat)))
			) {
			    if (!(flag & ALLOW_TRAPS)) {
				if (mon->mtrapseen & (1L << (ttmp->ttyp - 1)))
				    continue;
			    }
			    info[cnt] |= ALLOW_TRAPS;
			}
		    }
		}
		poss[cnt].x = nx;
		poss[cnt].y = ny;
		cnt++;
	    }
	}
	if (!cnt && wantpool && !is_pool(level, x,y)) {
		wantpool = FALSE;
		goto nexttry;
	}
	return cnt;
}